

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O2

int mbedtls_pk_verify_restartable
              (mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
              uchar *sig,size_t sig_len,mbedtls_pk_restart_ctx *rs_ctx)

{
  _func_int_void_ptr_mbedtls_md_type_t_uchar_ptr_size_t_uchar_ptr_size_t *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int iVar2;
  size_t local_38;
  
  iVar2 = -16000;
  if (ctx->pk_info != (mbedtls_pk_info_t *)0x0) {
    local_38 = hash_len;
    iVar1 = pk_hashlen_helper(md_alg,&local_38);
    if (iVar1 == 0) {
      UNRECOVERED_JUMPTABLE = ctx->pk_info->verify_func;
      if (UNRECOVERED_JUMPTABLE !=
          (_func_int_void_ptr_mbedtls_md_type_t_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
        iVar2 = (*UNRECOVERED_JUMPTABLE)(ctx->pk_ctx,md_alg,hash,local_38,sig,sig_len);
        return iVar2;
      }
      iVar2 = -0x3f00;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_pk_verify_restartable( mbedtls_pk_context *ctx,
               mbedtls_md_type_t md_alg,
               const unsigned char *hash, size_t hash_len,
               const unsigned char *sig, size_t sig_len,
               mbedtls_pk_restart_ctx *rs_ctx )
{
    PK_VALIDATE_RET( ctx != NULL );
    PK_VALIDATE_RET( ( md_alg == MBEDTLS_MD_NONE && hash_len == 0 ) ||
                     hash != NULL );
    PK_VALIDATE_RET( sig != NULL );

    if( ctx->pk_info == NULL ||
        pk_hashlen_helper( md_alg, &hash_len ) != 0 )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    /* optimization: use non-restartable version if restart disabled */
    if( rs_ctx != NULL &&
        mbedtls_ecp_restart_is_enabled() &&
        ctx->pk_info->verify_rs_func != NULL )
    {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

        if( ( ret = pk_restart_setup( rs_ctx, ctx->pk_info ) ) != 0 )
            return( ret );

        ret = ctx->pk_info->verify_rs_func( ctx->pk_ctx,
                   md_alg, hash, hash_len, sig, sig_len, rs_ctx->rs_ctx );

        if( ret != MBEDTLS_ERR_ECP_IN_PROGRESS )
            mbedtls_pk_restart_free( rs_ctx );

        return( ret );
    }
#else /* MBEDTLS_ECDSA_C && MBEDTLS_ECP_RESTARTABLE */
    (void) rs_ctx;
#endif /* MBEDTLS_ECDSA_C && MBEDTLS_ECP_RESTARTABLE */

    if( ctx->pk_info->verify_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    return( ctx->pk_info->verify_func( ctx->pk_ctx, md_alg, hash, hash_len,
                                       sig, sig_len ) );
}